

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O2

void Rml::Parse::Expression(DataParser *parser)

{
  bool bVar1;
  pointer pIVar2;
  pointer pIVar3;
  pointer pIVar4;
  pointer pIVar5;
  pointer pIVar6;
  pointer pIVar7;
  pointer pIVar8;
  pointer pIVar9;
  bool *out_valid_function_name;
  InstructionData *this;
  unsigned_long local_f0;
  String name;
  InstructionData local_b0;
  undefined1 local_80 [40];
  bool valid_function_name;
  
  Relational(parser);
LAB_00260277:
  do {
    while( true ) {
      while( true ) {
        if (parser->reached_end != false) {
          return;
        }
        out_valid_function_name = (bool *)parser->index;
        bVar1 = out_valid_function_name[(long)(parser->expression)._M_dataplus._M_p];
        if (bVar1 == true) break;
        if (bVar1 == true) {
          pIVar2 = (parser->program).
                   super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          pIVar3 = (parser->program).
                   super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          Variant::Variant((Variant *)local_80);
          DataParser::Emit(parser,JumpIfZero,(Variant *)local_80);
          Variant::~Variant((Variant *)local_80);
          DataParser::Match(parser,'?',true);
          Expression(parser);
          pIVar4 = (parser->program).
                   super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          pIVar5 = (parser->program).
                   super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          Variant::Variant((Variant *)&valid_function_name);
          DataParser::Emit(parser,Jump,(Variant *)&valid_function_name);
          Variant::~Variant((Variant *)&valid_function_name);
          DataParser::Match(parser,':',true);
          pIVar6 = (parser->program).
                   super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          pIVar7 = (parser->program).
                   super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          Expression(parser);
          pIVar8 = (parser->program).
                   super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pIVar9 = (parser->program).
                   super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          name._M_dataplus._M_p._0_4_ = 0x5a;
          local_f0 = ((long)pIVar6 - (long)pIVar7) / 0x30;
          Variant::Variant<unsigned_long,void>((Variant *)&name._M_string_length,&local_f0);
          DataParser::PatchInstruction
                    (parser,((long)pIVar2 - (long)pIVar3) / 0x30,(InstructionData *)&name);
          Variant::~Variant((Variant *)&name._M_string_length);
          local_b0.instruction = Jump;
          local_f0 = ((long)pIVar9 - (long)pIVar8) / 0x30;
          Variant::Variant<unsigned_long,void>(&local_b0.data,&local_f0);
          DataParser::PatchInstruction(parser,((long)pIVar4 - (long)pIVar5) / 0x30,&local_b0);
          Variant::~Variant(&local_b0.data);
          goto LAB_00260277;
        }
        if (bVar1 != true) {
          return;
        }
        DataParser::Match(parser,'&',false);
        DataParser::Match(parser,'&',true);
        DataParser::Push(parser);
        Relational(parser);
        DataParser::Pop(parser,L);
        Variant::Variant((Variant *)&name);
        DataParser::Emit(parser,And,(Variant *)&name);
        Variant::~Variant((Variant *)&name);
      }
      DataParser::Match(parser,'|',false);
      if ((parser->reached_end == false) &&
         (out_valid_function_name = (bool *)parser->index,
         out_valid_function_name[(long)(parser->expression)._M_dataplus._M_p] == true)) break;
      DataParser::Push(parser);
      DataParser::SkipWhitespace(parser);
      valid_function_name = true;
      VariableOrFunctionName_abi_cxx11_
                (&name,(Parse *)parser,(DataParser *)&valid_function_name,out_valid_function_name);
      if (name._M_string_length == 0) {
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b0,"Expected a transform function name but got an empty name.",
                   (allocator<char> *)local_80);
        DataParser::Error(parser,(String *)&local_b0);
        this = &local_b0;
LAB_00260587:
        ::std::__cxx11::string::~string((string *)this);
        ::std::__cxx11::string::~string((string *)&name);
        return;
      }
      if (valid_function_name == false) {
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_80,"Expected a transform function name but got an invalid name \'",
                         &name);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_80,"\'.");
        DataParser::Error(parser,(String *)&local_b0);
        ::std::__cxx11::string::~string((string *)&local_b0);
        this = (InstructionData *)local_80;
        goto LAB_00260587;
      }
      Function(parser,TransformFnc,&name,true);
      ::std::__cxx11::string::~string((string *)&name);
    }
    DataParser::Match(parser,'|',true);
    DataParser::Push(parser);
    Relational(parser);
    DataParser::Pop(parser,L);
    Variant::Variant((Variant *)&name);
    DataParser::Emit(parser,Or,(Variant *)&name);
    Variant::~Variant((Variant *)&name);
  } while( true );
}

Assistant:

static void Expression(DataParser& parser)
	{
		Relational(parser);

		bool looping = true;
		while (looping)
		{
			switch (parser.Look())
			{
			case '&': And(parser); break;
			case '|':
			{
				parser.Match('|', false);
				if (parser.Look() == '|')
					Or(parser);
				else
				{
					parser.Push();
					parser.SkipWhitespace();
					bool valid_function_name = true;
					String name = VariableOrFunctionName(parser, &valid_function_name);
					if (name.empty())
					{
						parser.Error("Expected a transform function name but got an empty name.");
						return;
					}
					if (!valid_function_name)
					{
						parser.Error("Expected a transform function name but got an invalid name '" + name + "'.");
						return;
					}

					Function(parser, Instruction::TransformFnc, std::move(name), true);
				}
			}
			break;
			case '?': Ternary(parser); break;
			default: looping = false;
			}
		}
	}